

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_Variable_Test::TestBody(ExprTest_Variable_Test *this)

{
  ExprBase EVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_50;
  AssertionResult gtest_ar__1;
  AssertHelper local_38;
  AssertionResult gtest_ar_;
  
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  EVar1.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                                  (&(this->super_ExprTest).factory_,0x2a);
  gtest_ar__1.success_ = true;
  gtest_ar__1._1_3_ = 0;
  local_50.data_._0_4_ = (EVar1.impl_)->kind_;
  testing::internal::CmpHelperEQ<mp::expr::Kind,mp::expr::Kind>
            ((internal *)&gtest_ar_,"expr::VARIABLE","e.kind()",(Kind *)&gtest_ar__1,
             (Kind *)&local_50);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xa6,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar__1.success_ = (ExprBase)EVar1.impl_ != (ExprBase)0x0;
  if ((ExprBase)EVar1.impl_ == (ExprBase)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"e != 0","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xa7,
               (char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  gtest_ar__1.success_ = true;
  gtest_ar__1._1_3_ = 0;
  local_50.data_._0_4_ = EVar1.impl_[1].kind_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_,"42","e.index()",(int *)&gtest_ar__1,(int *)&local_50);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xa8,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(ExprTest, Variable) {
  mp::Reference e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  e = factory_.MakeVariable(42);
  EXPECT_EQ(expr::VARIABLE, e.kind());
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(42, e.index());
}